

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

void * worker_thread(void *thread_func_param)

{
  byte *pbVar1;
  undefined8 *puVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  mg_context *ctx;
  _func_void_ptr_mg_context_ptr_int *p_Var6;
  socket *psVar7;
  code *pcVar8;
  size_t sVar9;
  __int32_t *p_Var10;
  _func_void_mg_context_ptr_int_void_ptr *p_Var11;
  double dVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  bool bVar20;
  bool bVar21;
  mg_header *pmVar22;
  char cVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  void *pvVar27;
  void *pvVar28;
  time_t tVar29;
  ushort **ppuVar30;
  ulong uVar31;
  char *pcVar32;
  char *pcVar33;
  char *pcVar34;
  size_t sVar35;
  ptrdiff_t pVar36;
  long lVar37;
  size_t __n;
  longlong lVar38;
  int *piVar39;
  tm *__tp;
  uint in_ECX;
  long lVar40;
  Elf64_Ehdr *mcx;
  char cVar41;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *func;
  mg_context *ctx_00;
  char *func_00;
  time_t *t;
  mg_file_stat *extraout_RDX_02;
  char *func_01;
  mg_file_stat *extraout_RDX_03;
  mg_file_stat *extraout_RDX_04;
  mg_file_stat *filep;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  mg_http_method_info *pmVar42;
  uint uVar43;
  char *pcVar44;
  ulong uVar45;
  mg_connection *pmVar46;
  long lVar47;
  char *pcVar48;
  byte *pbVar49;
  char *pcVar50;
  char *pcVar51;
  pthread_mutex_t *__mutex;
  bool bVar52;
  mg_connection *conn;
  int local_4270;
  int local_426c;
  mg_header *local_4268;
  __int32_t **local_4260;
  mg_file file;
  mg_handler_info *handler_info;
  usa *local_4228;
  undefined8 *local_4220;
  mg_request_handler callback_handler;
  int local_420c;
  void *auth_callback_data;
  mg_authorization_handler auth_handler;
  void *callback_data;
  char mult;
  undefined7 uStack_41ef;
  size_t local_41e8;
  pthread_mutex_t *local_41e0;
  time_t *local_41d8;
  char *local_41d0;
  undefined8 *local_41c8;
  char *local_41c0;
  pthread_cond_t *local_41b8;
  pthread_mutex_t *local_41b0;
  pthread_cond_t *local_41a8;
  time_t curtime;
  mg_websocket_close_handler ws_close_handler;
  mg_websocket_data_handler ws_data_handler;
  mg_websocket_ready_handler ws_ready_handler;
  mg_websocket_connect_handler ws_connect_handler;
  vec filename_vec;
  char ebuf [100];
  undefined4 local_40f8 [2];
  char *local_40f0;
  void *local_40e8;
  char *local_40e0;
  mg_websocket_subprotocols *subprotocols;
  _union_1457 local_40d0;
  undefined1 local_40c8 [144];
  char *portend;
  char *local_4030;
  vec val;
  char local_1039;
  char path [4096];
  
  pvVar27 = (void *)0x0;
  memset(local_40c8,0,0x90);
  local_40d0 = (_union_1457)0x1;
  sigaction(0xd,(sigaction *)&local_40d0,(sigaction *)0x0);
  ctx = *(mg_context **)((long)thread_func_param + 0x8e0);
  mg_set_thread_name("worker");
  local_40f8[0] = 0;
  LOCK();
  UNLOCK();
  local_40f0 = (char *)(ulong)((int)thread_idx_max + 1);
  thread_idx_max = thread_idx_max + 1;
  pthread_setspecific(sTlsKey,local_40f8);
  p_Var6 = (ctx->callbacks).init_thread;
  pcVar34 = extraout_RDX;
  if (p_Var6 != (_func_void_ptr_mg_context_ptr_int *)0x0) {
    pvVar27 = (*p_Var6)(ctx,1);
    pcVar34 = extraout_RDX_00;
  }
  uVar43 = (int)((ulong)((long)thread_func_param - (long)ctx->worker_connections) >> 3) * 0x6f71de15
  ;
  local_40e8 = pvVar27;
  if (((int)uVar43 < 0) || (ctx->cfg_worker_threads <= uVar43)) {
    pcVar44 = "Internal error: Invalid worker index %i";
  }
  else {
    uVar5 = ctx->max_request_size;
    pvVar28 = malloc((ulong)uVar5);
    *(void **)((long)thread_func_param + 0x970) = pvVar28;
    if (pvVar28 != (void *)0x0) {
      *(uint *)((long)thread_func_param + 0x990) = uVar5;
      *(mg_domain_context **)((long)thread_func_param + 0x8e8) = &ctx->dd;
      *(void **)((long)thread_func_param + 0x9e0) = pvVar27;
      *(void **)((long)thread_func_param + 0x90) = ctx->user_data;
      iVar24 = pthread_mutex_init((pthread_mutex_t *)((long)thread_func_param + 0x9b8),
                                  (pthread_mutexattr_t *)&pthread_mutex_attr);
      if (iVar24 != 0) {
        free(*(void **)((long)thread_func_param + 0x970));
        mg_cry_internal_wrap((mg_connection *)0x0,ctx,func,in_ECX,"%s","Cannot create mutex");
        return (void *)0x0;
      }
      local_41c8 = (undefined8 *)((long)thread_func_param + 0x8f8);
      __mutex = (pthread_mutex_t *)&ctx->thread_mutex;
      local_41a8 = (pthread_cond_t *)&ctx->sq_full;
      local_41b8 = (pthread_cond_t *)&ctx->sq_empty;
      local_41d8 = (time_t *)((long)thread_func_param + 0x938);
      local_4228 = (usa *)((long)thread_func_param + 0x918);
      local_41c0 = (char *)((long)thread_func_param + 0x48);
      local_4220 = (undefined8 *)((long)thread_func_param + 0x10);
      local_4268 = (mg_header *)((long)thread_func_param + 0xa8);
      local_41e0 = (pthread_mutex_t *)((long)thread_func_param + 0x9b8);
      local_41b0 = __mutex;
LAB_00115266:
      do {
        pthread_mutex_lock(__mutex);
        while ((ctx->sq_head == ctx->sq_tail && (ctx->stop_flag == 0))) {
          pthread_cond_wait(local_41a8,__mutex);
        }
        if (ctx->sq_tail < ctx->sq_head) {
          psVar7 = ctx->squeue;
          iVar24 = ctx->sq_tail % ctx->sq_size;
          uVar15 = *(undefined8 *)(psVar7 + iVar24);
          uVar16 = *(undefined8 *)((long)&psVar7[iVar24].lsa + 4);
          puVar2 = (undefined8 *)((long)&psVar7[iVar24].lsa + 0xc);
          uVar13 = *puVar2;
          uVar14 = puVar2[1];
          uVar17 = *(undefined8 *)&psVar7[iVar24].rsa;
          uVar18 = *(undefined8 *)((long)&psVar7[iVar24].rsa + 8);
          puVar2 = (undefined8 *)((long)&psVar7[iVar24].rsa + 0x10);
          uVar19 = puVar2[1];
          local_41c8[6] = *puVar2;
          local_41c8[7] = uVar19;
          local_41c8[4] = uVar17;
          local_41c8[5] = uVar18;
          local_41c8[2] = uVar13;
          local_41c8[3] = uVar14;
          *local_41c8 = uVar15;
          local_41c8[1] = uVar16;
          ctx->sq_tail = ctx->sq_tail + 1;
          iVar24 = ctx->sq_size;
          while (iVar24 < ctx->sq_tail) {
            ctx->sq_tail = ctx->sq_tail - iVar24;
            ctx->sq_head = ctx->sq_head - iVar24;
          }
        }
        pthread_cond_signal(local_41b8);
        pthread_mutex_unlock(__mutex);
        if (ctx->stop_flag != 0) {
          p_Var11 = (ctx->callbacks).exit_thread;
          if (p_Var11 != (_func_void_mg_context_ptr_int_void_ptr *)0x0) {
            (*p_Var11)(ctx,1,local_40e8);
          }
          pthread_setspecific(sTlsKey,(void *)0x0);
          pthread_mutex_destroy(local_41e0);
          *(undefined4 *)((long)thread_func_param + 0x990) = 0;
          free(*(void **)((long)thread_func_param + 0x970));
          *(undefined8 *)((long)thread_func_param + 0x970) = 0;
          if (*(void **)((long)thread_func_param + 0x28) ==
              *(void **)((long)thread_func_param + 0x20)) {
            return (void *)0x0;
          }
          free(*(void **)((long)thread_func_param + 0x28));
          *(undefined8 *)((long)thread_func_param + 0x28) = 0;
          return (void *)0x0;
        }
        local_40e0 = (char *)0x0;
        tVar29 = time((time_t *)0x0);
        *(time_t *)((long)thread_func_param + 0x938) = tVar29;
        *(uint *)((long)thread_func_param + 0x80) =
             (uint)(ushort)(*(ushort *)((long)thread_func_param + 0x91a) << 8 |
                           *(ushort *)((long)thread_func_param + 0x91a) >> 8);
        *(uint *)((long)thread_func_param + 0x84) =
             (uint)(ushort)(*(ushort *)((long)thread_func_param + 0x8fe) << 8 |
                           *(ushort *)((long)thread_func_param + 0x8fe) >> 8);
        sockaddr_to_string(local_41c0,0x30,local_4228);
        *(uint *)((long)thread_func_param + 0x88) = (uint)*(byte *)((long)thread_func_param + 0x934)
        ;
      } while (*(byte *)((long)thread_func_param + 0x934) != 0);
      lVar47 = *(long *)(*(long *)((long)thread_func_param + 0x8e8) + 0x58);
      local_4260 = __ctype_tolower_loc();
      lVar40 = 0;
      do {
        bVar3 = *(byte *)(lVar47 + lVar40);
        iVar24 = (*local_4260)[bVar3];
        iVar25 = (*local_4260)[(byte)"yes"[lVar40]];
        if (bVar3 == 0) break;
        lVar40 = lVar40 + 1;
      } while (iVar24 == iVar25);
      if (iVar24 != iVar25) {
        *(undefined4 *)((long)thread_func_param + 0x980) = 1;
      }
      *(undefined4 *)((long)thread_func_param + 0x998) = 0;
      *(undefined4 *)((long)thread_func_param + 0x98c) = 0;
      *(undefined4 *)thread_func_param = 0;
      *(undefined8 *)((long)thread_func_param + 0x4b0) = 0;
      *(undefined8 *)((long)thread_func_param + 0x98) = 0;
      pcVar8 = *(code **)(*(int **)((long)thread_func_param + 0x8e0) + 0xa0e6);
      if ((pcVar8 != (code *)0x0) && (**(int **)((long)thread_func_param + 0x8e0) == 1)) {
        portend = (char *)0x0;
        (*pcVar8)(thread_func_param,&portend);
        *(char **)((long)thread_func_param + 0x98) = portend;
      }
      *(undefined4 *)((long)thread_func_param + 4) = 0;
LAB_0011545f:
      *(undefined4 *)thread_func_param = 1;
      iVar24 = get_message((mg_connection *)thread_func_param,ebuf,100,&local_4270);
      if (iVar24 != 0) {
        pbVar49 = *(byte **)((long)thread_func_param + 0x970);
        iVar24 = *(int *)((long)thread_func_param + 0x990);
        *(undefined8 *)((long)thread_func_param + 0x30) = 0;
        *(undefined8 *)((long)thread_func_param + 0x40) = 0;
        *(undefined4 *)((long)thread_func_param + 0xa0) = 0;
        *local_4220 = 0;
        local_4220[1] = 0;
        if (iVar24 < 1) {
          portend = (char *)pbVar49;
          if (iVar24 != 0) {
            bVar3 = *pbVar49;
            ppuVar30 = __ctype_b_loc();
            uVar4 = (*ppuVar30)[bVar3];
            lVar47 = 0;
LAB_00115518:
            if (((uVar4 & 2) == 0) &&
               (uVar43 = get_http_header_len((char *)pbVar49,iVar24), 0 < (int)uVar43)) {
              pbVar49[(ulong)uVar43 - 1] = 0;
              if ((0xd < *pbVar49) || ((0x2401U >> (*pbVar49 & 0x1f) & 1) == 0)) {
                *local_4220 = pbVar49;
                iVar24 = skip_to_end_of_word_and_terminate(&portend,0);
                if (0 < iVar24) {
                  *(char **)((long)thread_func_param + 0x18) = portend;
                  iVar24 = skip_to_end_of_word_and_terminate(&portend,0);
                  if (0 < iVar24) {
                    *(char **)((long)thread_func_param + 0x30) = portend;
                    iVar24 = skip_to_end_of_word_and_terminate(&portend,1);
                    if (0 < iVar24) {
                      pcVar34 = *(char **)((long)thread_func_param + 0x30);
                      iVar24 = strncmp(pcVar34,"HTTP/",5);
                      if (iVar24 == 0) {
                        *(char **)((long)thread_func_param + 0x30) = pcVar34 + 5;
                        pcVar34 = *(char **)((long)thread_func_param + 0x10);
                        pmVar42 = http_methods;
                        pcVar44 = "GET";
                        do {
                          pmVar42 = pmVar42 + 1;
                          iVar24 = strcmp(pcVar44,pcVar34);
                          if (iVar24 == 0) {
                            iVar24 = parse_http_headers(&portend,local_4268);
                            *(int *)((long)thread_func_param + 0xa0) = iVar24;
                            if ((-1 < iVar24) &&
                               (iVar25 = uVar43 + (int)lVar47,
                               iVar25 != 0 && SCARRY4(uVar43,(int)lVar47) == iVar25 < 0)) {
                              pcVar34 = get_header(local_4268,iVar24,"Host");
                              if (pcVar34 == (char *)0x0) goto LAB_001164a7;
                              if (*pcVar34 == '[') {
                                pcVar44 = strchr(pcVar34,0x5d);
                                if (pcVar44 == (char *)0x0) goto LAB_001164a7;
                                pcVar44 = pcVar44 + (1 - (long)pcVar34);
                              }
                              else {
                                pcVar44 = strchr(pcVar34,0x3a);
                                if (pcVar44 == (char *)0x0) {
                                  pcVar44 = (char *)strlen(pcVar34);
                                }
                                else {
                                  pcVar44 = pcVar44 + -(long)pcVar34;
                                }
                              }
                              if (*(long *)((long)thread_func_param + 0x8f0) == 0) {
                                lVar47 = *(long *)((long)thread_func_param + 0x8e0) + 0x283a8;
                                goto LAB_0011641a;
                              }
                              pcVar32 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0xf8
                                                  );
                              if (((pcVar32 == (char *)0x0) ||
                                  (*(long *)((long)thread_func_param + 0x8e8) ==
                                   *(long *)((long)thread_func_param + 0x8e0) + 0x283a8)) ||
                                 ((pcVar33 = (char *)strlen(pcVar32), pcVar33 == pcVar44 &&
                                  (iVar24 = mg_strncasecmp(pcVar34,pcVar32,(size_t)pcVar44),
                                  iVar24 == 0)))) goto LAB_001164a7;
                            }
                            break;
                          }
                          pcVar44 = pmVar42->name;
                        } while (pcVar44 != (char *)0x0);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          ppuVar30 = __ctype_b_loc();
          lVar47 = 0;
          do {
            uVar4 = (*ppuVar30)[pbVar49[lVar47]];
            if ((uVar4 >> 0xd & 1) == 0) {
              pbVar49 = pbVar49 + lVar47;
              iVar24 = iVar24 - (int)lVar47;
              portend = (char *)pbVar49;
              goto LAB_00115518;
            }
            lVar47 = lVar47 + 1;
          } while (iVar24 != (int)lVar47);
        }
        mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"%s");
        local_4270 = 400;
        iVar24 = local_4270;
        goto LAB_00115591;
      }
      iVar24 = local_4270;
      if (0 < local_4270) goto LAB_00115591;
      goto LAB_001155a2;
    }
    pcVar44 = "Out of memory: Cannot allocate buffer for worker %i";
    pcVar34 = extraout_RDX_01;
  }
  mg_cry_internal_wrap((mg_connection *)0x0,ctx,pcVar34,in_ECX,pcVar44,(ulong)uVar43);
  return (void *)0x0;
  while( true ) {
    piVar39 = *(int **)((long)thread_func_param + 0x8e0);
    if ((piVar39 == (int *)0x0) || (*piVar39 != 1)) {
      lVar47 = *(long *)(lVar47 + 0x1f8);
    }
    else {
      pthread_mutex_lock((pthread_mutex_t *)(piVar39 + 0xa0ba));
      piVar39 = *(int **)((long)thread_func_param + 0x8e0);
      lVar47 = *(long *)(lVar47 + 0x1f8);
      if ((piVar39 != (int *)0x0) && (*piVar39 == 1)) {
        pthread_mutex_unlock((pthread_mutex_t *)(piVar39 + 0xa0ba));
      }
    }
    if (lVar47 == 0) break;
LAB_0011641a:
    pcVar32 = *(char **)(lVar47 + 0xf8);
    pcVar33 = (char *)strlen(pcVar32);
    if ((pcVar33 == pcVar44) &&
       (iVar24 = mg_strncasecmp(pcVar34,pcVar32,(size_t)pcVar44), iVar24 == 0)) {
      *(long *)((long)thread_func_param + 0x8e8) = lVar47;
      break;
    }
  }
LAB_001164a7:
  pmVar22 = local_4268;
  iVar24 = *(int *)((long)thread_func_param + 0xa0);
  pcVar34 = get_header(local_4268,iVar24,"Transfer-Encoding");
  if (pcVar34 == (char *)0x0) {
LAB_0011650d:
    pcVar34 = get_header(pmVar22,iVar24,"Content-Length");
    if (pcVar34 == (char *)0x0) {
      *(undefined8 *)((long)thread_func_param + 0x958) = 0;
    }
    else {
      portend = (char *)0x0;
      lVar38 = strtoll(pcVar34,&portend,10);
      *(longlong *)((long)thread_func_param + 0x958) = lVar38;
      if (lVar38 < 0 || portend == pcVar34) {
        mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"%s");
        local_4270 = 0x19b;
        iVar24 = local_4270;
        goto LAB_00115591;
      }
      *(longlong *)((long)thread_func_param + 0x78) = lVar38;
    }
LAB_0011661c:
    pcVar34 = *(char **)((long)thread_func_param + 0x30);
    iVar24 = strcmp(pcVar34,"1.0");
    if ((iVar24 != 0) && (iVar24 = strcmp(pcVar34,"1.1"), iVar24 != 0)) {
      mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"Bad HTTP version: [%s]");
      iVar24 = 0x1f9;
      goto LAB_00115591;
    }
  }
  else {
    p_Var10 = *local_4260;
    lVar47 = 0;
    do {
      pbVar49 = (byte *)(pcVar34 + lVar47);
      pbVar1 = (byte *)("identity" + lVar47);
      if (*pbVar49 == 0) break;
      lVar47 = lVar47 + 1;
    } while (p_Var10[*pbVar49] == p_Var10[*pbVar1]);
    if (p_Var10[*pbVar49] == p_Var10[*pbVar1]) goto LAB_0011650d;
    lVar47 = 0;
    do {
      pbVar49 = (byte *)(pcVar34 + lVar47);
      pbVar1 = (byte *)("chunked" + lVar47);
      if (*pbVar49 == 0) break;
      lVar47 = lVar47 + 1;
    } while (p_Var10[*pbVar49] == p_Var10[*pbVar1]);
    if (p_Var10[*pbVar49] == p_Var10[*pbVar1]) {
      *(undefined4 *)((long)thread_func_param + 0x968) = 1;
      *(undefined8 *)((long)thread_func_param + 0x958) = 0;
      goto LAB_0011661c;
    }
    mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"%s");
    local_4270 = 400;
    iVar24 = local_4270;
LAB_00115591:
    mg_send_http_error((mg_connection *)thread_func_param,iVar24,"%s");
  }
LAB_001155a2:
  if (ebuf[0] == '\0') {
    pcVar34 = *(char **)((long)thread_func_param + 0x18);
    cVar23 = *pcVar34;
    if (cVar23 == '\0') {
LAB_00115603:
      lVar47 = 0x18;
      pcVar44 = "http://";
      do {
        sVar9 = *(size_t *)((long)&http_methods[0x10].is_safe + lVar47);
        iVar24 = mg_strncasecmp(pcVar34,pcVar44,sVar9);
        if (iVar24 == 0) {
          pcVar44 = strchr(pcVar34 + sVar9,0x2f);
          if (pcVar44 == (char *)0x0) break;
          pcVar33 = strchr(pcVar34 + sVar9,0x3a);
          pcVar32 = pcVar34;
          if (pcVar33 != (char *)0x0) {
            uVar31 = strtoul(pcVar33 + 1,&portend,10);
            if ((portend != pcVar44) || (uVar31 - 0x10000 < 0xffffffffffff0001)) break;
            pcVar32 = *(char **)((long)thread_func_param + 0x18);
          }
          lVar47 = 0;
          goto LAB_001156c4;
        }
        pcVar44 = *(char **)((long)&abs_uri_protocols[0].proto + lVar47);
        lVar47 = lVar47 + 0x18;
      } while (lVar47 != 0x78);
LAB_0011571f:
      mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,ebuf,100,"Invalid URI");
      mg_send_http_error((mg_connection *)thread_func_param,400,"%s");
      pcVar34 = (char *)0x0;
    }
    else {
      pcVar44 = pcVar34;
      cVar41 = cVar23;
      if ((cVar23 == '*') && (pcVar34[1] == '\0')) {
        pcVar34 = (char *)0x0;
      }
      else {
        do {
          if (cVar41 < '!') goto LAB_0011571f;
          cVar41 = pcVar44[1];
          pcVar44 = pcVar44 + 1;
        } while (cVar41 != '\0');
        if (cVar23 != '/') goto LAB_00115603;
      }
    }
LAB_00115987:
    *(char **)((long)thread_func_param + 0x20) = pcVar34;
    *(char **)((long)thread_func_param + 0x28) = pcVar34;
    if (ebuf[0] != '\0') goto LAB_0011599d;
    iVar24 = *(int *)((long)thread_func_param + 0xa0);
    if ((long)iVar24 < 1) {
LAB_00115b93:
      pcVar44 = (char *)0x0;
    }
    else {
      p_Var10 = *local_4260;
      uVar45 = 0;
      uVar31 = 0;
      do {
        lVar47 = 0;
        do {
          iVar25 = p_Var10[(byte)"Connection"[lVar47]];
          iVar26 = p_Var10[(byte)local_4268[uVar45].name[lVar47]];
          if ("Connection"[lVar47] == 0) break;
          lVar47 = lVar47 + 1;
        } while (iVar25 == iVar26);
        if (iVar25 == iVar26) {
          iVar25 = (int)uVar31;
          uVar31 = (ulong)(iVar25 + 1);
          (&portend)[iVar25] = local_4268[uVar45].value;
        }
        uVar45 = uVar45 + 1;
      } while ((uVar45 < (ulong)(long)iVar24) && ((int)uVar31 < 8));
      if ((int)uVar31 < 1) {
        pcVar44 = (char *)0x0;
      }
      else {
        uVar45 = 0;
        bVar20 = false;
        do {
          pcVar44 = mg_strcasestr((&portend)[uVar45],"upgrade");
          if (pcVar44 != (char *)0x0) {
            bVar20 = true;
          }
          uVar45 = uVar45 + 1;
        } while (uVar31 != uVar45);
        if (bVar20) {
          pcVar32 = mg_get_header((mg_connection *)thread_func_param,"Upgrade");
          pcVar44 = (char *)0xffffffff;
          if (pcVar32 != (char *)0x0) {
            pcVar33 = mg_strcasestr(pcVar32,"websocket");
            pcVar44 = (char *)0x1;
            if (pcVar33 == (char *)0x0) {
              pcVar32 = mg_strcasestr(pcVar32,"h2");
              pcVar44 = (char *)0xffffffff;
              if (pcVar32 != (char *)0x0) goto LAB_00115b93;
            }
          }
        }
        else {
          pcVar44 = (char *)0x0;
        }
      }
    }
    *(int *)((long)thread_func_param + 4) = (int)pcVar44;
    if (pcVar34 == (char *)0x0) goto LAB_001159a5;
    callback_handler = (mg_request_handler)0x0;
    handler_info = (mg_handler_info *)0x0;
    ws_connect_handler = (mg_websocket_connect_handler)0x0;
    ws_ready_handler = (mg_websocket_ready_handler)0x0;
    ws_data_handler = (mg_websocket_data_handler)0x0;
    ws_close_handler = (mg_websocket_close_handler)0x0;
    callback_data = (void *)0x0;
    auth_handler = (mg_authorization_handler)0x0;
    auth_callback_data = (void *)0x0;
    curtime = time((time_t *)0x0);
    path[0] = '\0';
    *(undefined4 *)((long)thread_func_param + 8) = 0;
    pcVar34 = strchr(*(char **)((long)thread_func_param + 0x18),0x3f);
    *(char **)((long)thread_func_param + 0x38) = pcVar34;
    if (pcVar34 != (char *)0x0) {
      pcVar44 = pcVar34 + 1;
      *(char **)((long)thread_func_param + 0x38) = pcVar44;
      *pcVar34 = '\0';
    }
    if ((*(char *)((long)thread_func_param + 0x934) == '\0') &&
       (*(char *)((long)thread_func_param + 0x935) != '\0')) {
      lVar47 = *(long *)((long)thread_func_param + 0x8e0);
      if (lVar47 != 0) {
        lVar37 = 1;
        lVar40 = 0x3c;
        do {
          if ((ulong)*(uint *)(lVar47 + 0x18) + lVar37 == 1) goto LAB_00116017;
          lVar37 = lVar37 + -1;
          pcVar34 = (char *)(*(long *)(lVar47 + 8) + lVar40);
          lVar40 = lVar40 + 0x40;
        } while (*pcVar34 == '\0');
        if ((int)lVar37 < 1) {
          uVar4 = *(ushort *)(*(long *)(lVar47 + 8) + 6 + (ulong)(-(int)lVar37 & 0x7fffffff) * 0x40)
          ;
          pcVar44 = "https";
          if (*(int *)((long)thread_func_param + 4) == 1) {
            pcVar44 = "wss";
          }
          *(undefined4 *)((long)thread_func_param + 0x980) = 1;
          iVar24 = mg_construct_local_link
                             ((mg_connection *)thread_func_param,(char *)&portend,0x2000,pcVar44,
                              (uint)(ushort)(uVar4 << 8 | uVar4 >> 8),"yes");
          if (iVar24 < 0) {
LAB_001162c5:
            iVar24 = 500;
            pcVar44 = "Redirect URL too long";
LAB_00116889:
            mg_send_http_error((mg_connection *)thread_func_param,iVar24,"%s");
          }
          else {
            pcVar34 = *(char **)((long)thread_func_param + 0x38);
            if (pcVar34 != (char *)0x0) {
              sVar35 = strlen((char *)&portend);
              __n = strlen(pcVar34);
              pcVar44 = (char *)(__n + sVar35 + 2);
              if ((mg_match_context *)0x1fff < pcVar44) goto LAB_001162c5;
              *(undefined1 *)((long)&portend + sVar35) = 0x3f;
              memcpy((void *)((long)&portend + sVar35 + 1),pcVar34,__n);
              *(undefined1 *)((long)&portend + __n + sVar35 + 1) = 0;
            }
            mg_send_http_redirect((mg_connection *)thread_func_param,(char *)&portend,0x134);
          }
          goto LAB_00116aed;
        }
      }
LAB_00116017:
      pcVar44 = "Error: SSL forward not configured properly";
      mg_send_http_error((mg_connection *)thread_func_param,0x1f7,"%s");
      mg_cry_internal_wrap
                ((mg_connection *)thread_func_param,(mg_context *)0x0,func_00,(uint)pcVar44,"%s");
    }
    else {
      if (*(long *)((long)thread_func_param + 0x8e8) != 0) {
        pcVar44 = (char *)*local_4260;
        lVar47 = 0;
        do {
          bVar3 = *(byte *)(*(long *)(*(long *)((long)thread_func_param + 0x8e8) + 0x70) + lVar47);
          iVar24 = *(int *)((long)&((mg_match_context *)(((mg_match_context *)pcVar44)->match + -1))
                                   ->case_sensitive + (ulong)bVar3 * 4);
          iVar25 = *(int *)((long)&((mg_match_context *)(((mg_match_context *)pcVar44)->match + -1))
                                   ->case_sensitive + (ulong)(byte)"yes"[lVar47] * 4);
          if (bVar3 == 0) break;
          lVar47 = lVar47 + 1;
        } while (iVar24 == iVar25);
        if (iVar24 == iVar25) {
          pcVar34 = *(char **)((long)thread_func_param + 0x28);
          sVar35 = strlen(pcVar34);
          uVar43 = (int)sVar35 + 1;
          pcVar44 = (char *)(ulong)uVar43;
          mg_url_decode(pcVar34,(int)sVar35,pcVar34,uVar43,1);
        }
      }
      pcVar34 = *(char **)((long)thread_func_param + 0x38);
      if ((pcVar34 != (char *)0x0) && (*(long *)((long)thread_func_param + 0x8e8) != 0)) {
        pcVar44 = (char *)*local_4260;
        lVar47 = 0;
        do {
          bVar3 = *(byte *)(*(long *)(*(long *)((long)thread_func_param + 0x8e8) + 0x78) + lVar47);
          iVar24 = *(int *)((long)&((mg_match_context *)(((mg_match_context *)pcVar44)->match + -1))
                                   ->case_sensitive + (ulong)bVar3 * 4);
          iVar25 = *(int *)((long)&((mg_match_context *)(((mg_match_context *)pcVar44)->match + -1))
                                   ->case_sensitive + (ulong)(byte)"yes"[lVar47] * 4);
          if (bVar3 == 0) break;
          lVar47 = lVar47 + 1;
        } while (iVar24 == iVar25);
        if (iVar24 == iVar25) {
          sVar35 = strlen(pcVar34);
          uVar43 = (int)sVar35 + 1;
          pcVar44 = (char *)(ulong)uVar43;
          mg_url_decode(pcVar34,(int)sVar35,pcVar34,uVar43,1);
        }
      }
      pcVar34 = *(char **)((long)thread_func_param + 0x20);
      sVar35 = strlen(pcVar34);
      pcVar34 = mg_strndup_ctx(pcVar34,sVar35,ctx_00);
      if (pcVar34 != (char *)0x0) {
        remove_dot_segments(pcVar34);
        *(char **)((long)thread_func_param + 0x28) = pcVar34;
        pcVar32 = next_option(*(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x50),
                              (vec *)&portend,&val);
        if (pcVar32 == (char *)0x0) {
          iVar24 = 0;
        }
        else {
          iVar24 = 0;
          mcx = (Elf64_Ehdr *)pcVar44;
          do {
            mult = ',';
            if (val.ptr != (char *)0x0) {
              mcx = (Elf64_Ehdr *)&mult;
              iVar25 = __isoc99_sscanf(val.ptr,"%lf%c",&file);
              if ((0 < iVar25) && (0.0 <= (double)file.stat.size)) {
                mcx = (Elf64_Ehdr *)(ulong)(byte)mult;
                iVar25 = (*local_4260)[(long)mcx];
                if (iVar25 == 0x6b) {
                  dVar12 = 1024.0;
                }
                else {
                  if ((mult != ',') && (iVar25 != 0x6d)) goto LAB_00115e2d;
                  mcx = &Elf64_Ehdr_00100000;
                  iVar26 = 1;
                  if (iVar25 == 0x6d) {
                    iVar26 = 0x100000;
                  }
                  dVar12 = (double)iVar26;
                }
                file.stat.size = (uint64_t)((double)file.stat.size * dVar12);
                if ((local_4030 == (char *)0x1) && (*portend == '*')) {
                  iVar24 = (int)(double)file.stat.size;
                }
                else {
                  iVar25 = parse_match_net((vec *)&portend,local_4228,0);
                  if (iVar25 < 0) {
                    if ((portend != (char *)0x0) &&
                       (pVar36 = mg_match_alternatives
                                           (portend,(size_t)local_4030,pcVar34,
                                            (mg_match_context *)mcx), 0 < pVar36))
                    goto LAB_00115ee9;
                  }
                  else if (iVar25 != 0) {
LAB_00115ee9:
                    iVar24 = (int)(double)file.stat.size;
                  }
                }
              }
            }
LAB_00115e2d:
            pcVar32 = next_option(pcVar32,(vec *)&portend,&val);
            pcVar44 = (char *)mcx;
          } while (pcVar32 != (char *)0x0);
        }
        *(int *)((long)thread_func_param + 0x9a0) = iVar24;
        pcVar8 = *(code **)(*(long *)((long)thread_func_param + 0x8e0) + 0x28310);
        if (pcVar8 == (code *)0x0) {
LAB_001160b9:
          iVar24 = strcmp((char *)*local_4220,"OPTIONS");
          pmVar22 = local_4268;
          if (iVar24 == 0) {
            pcVar44 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x1a8);
            pcVar34 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x1b0);
            iVar24 = *(int *)((long)thread_func_param + 0xa0);
            pcVar33 = get_header(local_4268,iVar24,"Origin");
            pcVar32 = get_header(pmVar22,iVar24,"Access-Control-Request-Method");
            if (((pcVar34 != (char *)0x0) &&
                ((mg_match_context *)pcVar44 != (mg_match_context *)0x0 && *pcVar34 != '\0')) &&
               ((pcVar32 != (char *)0x0 && pcVar33 != (char *)0x0) &&
                *(byte *)&((mg_match_context *)pcVar44)->case_sensitive != 0)) {
              pcVar33 = get_header(local_4268,iVar24,"Access-Control-Request-Headers");
              gmt_time_string((char *)&portend,(size_t)&curtime,t);
              if (*pcVar34 != '*') {
                pcVar32 = pcVar34;
              }
              should_keep_alive((mg_connection *)thread_func_param);
              mg_printf((mg_connection *)thread_func_param,
                        "HTTP/1.1 200 OK\r\nDate: %s\r\nAccess-Control-Allow-Origin: %s\r\nAccess-Control-Allow-Methods: %s\r\nContent-Length: 0\r\nConnection: %s\r\n"
                        ,&portend,pcVar44,pcVar32);
              if (((pcVar33 != (char *)0x0) &&
                  (pcVar34 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x1b8),
                  pcVar34 != (char *)0x0)) && (*pcVar34 != '\0')) {
                if (*pcVar34 == '*') {
                  pcVar34 = pcVar33;
                }
                mg_printf((mg_connection *)thread_func_param,"Access-Control-Allow-Headers: %s\r\n",
                          pcVar34);
              }
              mg_printf((mg_connection *)thread_func_param,"Access-Control-Max-Age: 60\r\n");
              mg_printf((mg_connection *)thread_func_param,"\r\n");
              goto LAB_00116aed;
            }
          }
          iVar24 = *(int *)((long)thread_func_param + 4);
          iVar25 = get_request_handler((mg_connection *)thread_func_param,0,&callback_handler,
                                       &subprotocols,&ws_connect_handler,&ws_ready_handler,
                                       &ws_data_handler,&ws_close_handler,
                                       (mg_authorization_handler *)0x0,&callback_data,&handler_info)
          ;
          if (iVar25 == 0) goto LAB_001166ad;
          bVar52 = iVar24 != 1;
          iVar24 = is_put_or_delete_method((mg_connection *)thread_func_param);
          bVar21 = true;
          bVar20 = false;
LAB_001167f7:
          do {
            pcVar44 = (char *)0x0;
            iVar25 = get_request_handler((mg_connection *)thread_func_param,2,
                                         (mg_request_handler *)0x0,(mg_websocket_subprotocols **)0x0
                                         ,(mg_websocket_connect_handler *)0x0,
                                         (mg_websocket_ready_handler *)0x0,
                                         (mg_websocket_data_handler *)0x0,
                                         (mg_websocket_close_handler *)0x0,&auth_handler,
                                         &auth_callback_data,(mg_handler_info **)0x0);
            if (iVar25 == 0) {
              if (bVar21 || iVar24 == 0) {
                file.stat.is_directory = 0;
                file.stat.is_gzipped = 0;
                file.stat.location = 0;
                file.stat._28_4_ = 0;
                file.stat.size = 0;
                file.stat.last_modified = 0;
                file.access.fp = (FILE *)0x0;
                if (*(long *)((long)thread_func_param + 0x8e8) != 0) {
                  pcVar34 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0xf0);
                  do {
                    pcVar34 = next_option(pcVar34,(vec *)&mult,&filename_vec);
                    filep = extraout_RDX_02;
                    if (pcVar34 == (char *)0x0) goto LAB_00116a99;
                    iVar24 = bcmp(*(void **)((long)thread_func_param + 0x28),
                                  (void *)CONCAT71(uStack_41ef,mult),local_41e8);
                  } while (iVar24 != 0);
                  pcVar44 = (char *)0x1000;
                  mg_snprintf((mg_connection *)thread_func_param,&local_420c,(char *)&val,0x1000,
                              "%.*s",(ulong)(uint)filename_vec.len,filename_vec.ptr);
                  if ((local_420c != 0) ||
                     (iVar24 = mg_fopen((mg_connection *)&val,(char *)0x1,(int)&file,
                                        (mg_file *)pcVar44), filep = extraout_RDX_04, iVar24 == 0))
                  {
                    piVar39 = __errno_location();
                    pcVar34 = strerror(*piVar39);
                    pcVar44 = (char *)&val;
                    mg_cry_internal_wrap
                              ((mg_connection *)thread_func_param,(mg_context *)0x0,func_01,
                               (uint)pcVar44,"%s: cannot open %s: %s","check_authorization",pcVar44,
                               pcVar34);
                    filep = extraout_RDX_03;
                  }
LAB_00116a99:
                  if (file.access.fp == (FILE *)0x0) {
                    if (*(long *)((long)thread_func_param + 0x8e8) == 0) goto LAB_00116865;
                    pmVar46 = *(mg_connection **)
                               (*(long *)((long)thread_func_param + 0x8e8) + 0x120);
                    if (pmVar46 == (mg_connection *)0x0) {
                      iVar24 = mg_stat((mg_connection *)path,(char *)&file,filep);
                      if ((iVar24 == 0) || (file.stat.is_directory == 0)) {
                        sVar35 = strlen(path);
                        uVar43 = (uint)sVar35;
                        pcVar34 = path + (sVar35 - 1);
                        do {
                          uVar43 = uVar43 - 1;
                          if (pcVar34 <= path) break;
                          cVar23 = *pcVar34;
                          pcVar34 = pcVar34 + -1;
                        } while (cVar23 != '/');
                        pcVar44 = (char *)0x1000;
                        mg_snprintf((mg_connection *)thread_func_param,&local_426c,(char *)&portend,
                                    0x1000,"%.*s/%s",(ulong)uVar43,path,".htpasswd");
                      }
                      else {
                        pcVar44 = (char *)0x1000;
                        mg_snprintf((mg_connection *)thread_func_param,&local_426c,(char *)&portend,
                                    0x1000,"%s/%s",path,".htpasswd");
                      }
                      pmVar46 = (mg_connection *)&portend;
                      if (local_426c == 0) goto LAB_00116e3b;
                    }
                    else {
LAB_00116e3b:
                      mg_fopen(pmVar46,(char *)0x1,(int)&file,(mg_file *)pcVar44);
                    }
                    if (file.access.fp == (FILE *)0x0) goto LAB_00116865;
                  }
                  iVar24 = authorize((mg_connection *)thread_func_param,&file,(char *)0x0);
                  if (file.access.fp != (FILE *)0x0) {
                    fclose((FILE *)file.access.fp);
                  }
                  if (iVar24 != 0) goto LAB_00116865;
                }
                send_authorization_request((mg_connection *)thread_func_param,(char *)0x0);
LAB_00116ae5:
                release_handler_ref((mg_connection *)thread_func_param,handler_info);
              }
              else {
                pcVar44 = *(char **)((long)thread_func_param + 0x10);
                mg_send_http_error((mg_connection *)thread_func_param,0x195,"%s method not allowed")
                ;
              }
              goto LAB_00116aed;
            }
            iVar24 = (*auth_handler)((mg_connection *)thread_func_param,auth_callback_data);
            if (iVar24 == 0) goto LAB_00116ae5;
LAB_00116865:
            if (bVar20) {
              iVar24 = 0x194;
              pcVar44 = "Not Found";
              goto LAB_00116889;
            }
            if (!bVar52) goto LAB_00116aed;
            iVar24 = (*callback_handler)((mg_connection *)thread_func_param,callback_data);
            release_handler_ref((mg_connection *)thread_func_param,handler_info);
            if (0 < iVar24) {
              *(int *)((long)thread_func_param + 0x99c) = iVar24;
              if (*(int *)((long)thread_func_param + 0x980) == 0) {
                do {
                  iVar24 = mg_read((mg_connection *)thread_func_param,&portend,0x2000);
                } while (0 < iVar24);
              }
              goto LAB_00116aed;
            }
            callback_handler = (mg_request_handler)0x0;
LAB_001166ad:
            path[0] = '\0';
            iVar24 = is_put_or_delete_method((mg_connection *)thread_func_param);
            pcVar44 = *(char **)((long)thread_func_param + 0x10);
            bVar52 = true;
            if ((mg_match_context *)pcVar44 != (mg_match_context *)0x0) {
              iVar25 = strcmp(pcVar44,"PROPFIND");
              bVar52 = false;
              if (iVar25 != 0) {
                iVar25 = strcmp(pcVar44,"PROPPATCH");
                bVar52 = false;
                if (iVar25 != 0) {
                  iVar25 = strcmp(pcVar44,"LOCK");
                  bVar52 = false;
                  if (iVar25 != 0) {
                    iVar25 = strcmp(pcVar44,"UNLOCK");
                    bVar52 = false;
                    if (iVar25 != 0) {
                      iVar25 = strcmp(pcVar44,"MOVE");
                      bVar52 = false;
                      if (iVar25 != 0) {
                        iVar25 = strcmp(pcVar44,"COPY");
                        bVar52 = iVar25 != 0;
                      }
                    }
                  }
                }
              }
            }
            *(undefined4 *)((long)thread_func_param + 0x984) = 0;
            lVar47 = 0xa0;
            lVar40 = 0xa8;
            if (*thread_func_param == 1) {
LAB_00116781:
              pcVar34 = get_header((mg_header *)(lVar40 + (long)thread_func_param),
                                   *(int *)((long)thread_func_param + lVar47),"Accept-Encoding");
              if ((pcVar34 != (char *)0x0) &&
                 (pcVar34 = strstr(pcVar34,"gzip"), pcVar34 != (char *)0x0)) {
                *(undefined4 *)((long)thread_func_param + 0x984) = 1;
              }
            }
            else if (*thread_func_param == 2) {
              lVar47 = 0x4d8;
              lVar40 = 0x4e0;
              goto LAB_00116781;
            }
            bVar20 = true;
            bVar21 = false;
            if (bVar52) {
              bVar52 = true;
              goto LAB_001167f7;
            }
            bVar21 = false;
            bVar52 = true;
          } while (**(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0x118) == 'y');
          mg_send_http_error((mg_connection *)thread_func_param,0x195,"%s method not allowed");
        }
        else {
          iVar24 = (*pcVar8)(thread_func_param);
          if (iVar24 < 1) {
            if (iVar24 == 0) goto LAB_001160b9;
          }
          else {
            *(int *)((long)thread_func_param + 0x99c) = iVar24;
            if (*(int *)((long)thread_func_param + 0x980) == 0) {
              do {
                iVar24 = mg_read((mg_connection *)thread_func_param,&portend,0x2000);
              } while (0 < iVar24);
            }
          }
        }
      }
    }
LAB_00116aed:
    pcVar8 = *(code **)(*(long *)((long)thread_func_param + 0x8e0) + 0x28318);
    if (pcVar8 != (code *)0x0) {
      (*pcVar8)(thread_func_param);
    }
    if (*(long *)((long)thread_func_param + 0x8e8) != 0) {
      portend = (char *)((ulong)portend & 0xffffffffffffff00);
      pmVar46 = *(mg_connection **)(*(long *)((long)thread_func_param + 0x8e8) + 0x88);
      if ((pmVar46 == (mg_connection *)0x0) ||
         (iVar24 = mg_fopen(pmVar46,(char *)0x4,(int)&file,(mg_file *)pcVar44), iVar24 == 0)) {
        file.access.fp = (FILE *)0x0;
LAB_00116b56:
        if (*(long *)(*(long *)((long)thread_func_param + 0x8e0) + 0x28328) == 0) goto LAB_001159b0;
      }
      else if (file.access.fp == (FILE *)0x0) goto LAB_00116b56;
      __tp = localtime(local_41d8);
      if (__tp == (tm *)0x0) {
        cVar23 = '0';
        lVar47 = 0;
        do {
          *(char *)((long)&val.ptr + lVar47) = cVar23;
          cVar23 = "01/Jan/1970:00:00:00 +0000"[lVar47 + 1];
          lVar47 = lVar47 + 1;
        } while (lVar47 != 0x1a);
      }
      else {
        strftime((char *)&val,0x40,"%d/%b/%Y:%H:%M:%S %z",__tp);
      }
      sockaddr_to_string(path,0x32,local_4228);
      iVar24 = *thread_func_param;
      if (iVar24 == 1) {
        lVar47 = 0xa0;
        lVar40 = 0xa8;
LAB_00116bfc:
        pcVar34 = get_header((mg_header *)(lVar40 + (long)thread_func_param),
                             *(int *)((long)thread_func_param + lVar47),"Referer");
      }
      else {
        if (iVar24 == 2) {
          lVar47 = 0x4d8;
          lVar40 = 0x4e0;
          goto LAB_00116bfc;
        }
        pcVar34 = (char *)0x0;
      }
      if (pcVar34 == (char *)0x0) {
        pcVar34 = "-";
      }
      if (iVar24 == 1) {
        lVar47 = 0xa0;
        lVar40 = 0xa8;
LAB_00116c45:
        pcVar44 = get_header((mg_header *)(lVar40 + (long)thread_func_param),
                             *(int *)((long)thread_func_param + lVar47),"User-Agent");
      }
      else {
        if (iVar24 == 2) {
          lVar47 = 0x4d8;
          lVar40 = 0x4e0;
          goto LAB_00116c45;
        }
        pcVar44 = (char *)0x0;
      }
      if (pcVar44 == (char *)0x0) {
        pcVar44 = "-";
      }
      pcVar32 = *(char **)((long)thread_func_param + 0x40);
      if (pcVar32 == (char *)0x0) {
        pcVar32 = "-";
      }
      pcVar33 = *(char **)((long)thread_func_param + 0x10);
      pcVar51 = *(char **)((long)thread_func_param + 0x18);
      if (pcVar33 == (char *)0x0) {
        pcVar33 = "-";
      }
      if (pcVar51 == (char *)0x0) {
        pcVar51 = "-";
      }
      pcVar50 = *(char **)((long)thread_func_param + 0x38);
      pcVar48 = "?";
      if (pcVar50 == (char *)0x0) {
        pcVar48 = "";
        pcVar50 = "";
      }
      local_41d0 = (char *)(ulong)*(uint *)((long)thread_func_param + 0x99c);
      uVar43 = 0x1000;
      mg_snprintf((mg_connection *)thread_func_param,(int *)0x0,(char *)&portend,0x1000,
                  "%s - %s [%s] \"%s %s%s%s HTTP/%s\" %d %ld %s %s",path,pcVar32,&val,pcVar33,
                  pcVar51,pcVar48,pcVar50,*(undefined8 *)((long)thread_func_param + 0x30),local_41d0
                  ,*(undefined8 *)((long)thread_func_param + 0x950),pcVar34,pcVar44);
      pcVar8 = *(code **)(*(long *)((long)thread_func_param + 0x8e0) + 0x28328);
      if ((pcVar8 == (code *)0x0) || (iVar24 = (*pcVar8)(thread_func_param), iVar24 == 0)) {
        if (file.access.fp != (FILE *)0x0) {
          flockfile((FILE *)file.access.fp);
          iVar24 = fprintf((FILE *)file.access.fp,"%s\n",&portend);
          iVar25 = fflush((FILE *)file.access.fp);
          funlockfile((FILE *)file.access.fp);
          pcVar34 = extraout_RDX_05;
          if (file.access.fp != (FILE *)0x0) {
            iVar26 = fclose((FILE *)file.access.fp);
            file.access.fp = (FILE *)0x0;
            pcVar34 = extraout_RDX_06;
            if ((0 < iVar24) && (iVar26 == 0 && iVar25 == 0)) goto LAB_001159b0;
          }
          file.access.fp = (FILE *)0x0;
          mg_cry_internal_wrap
                    ((mg_connection *)thread_func_param,(mg_context *)0x0,pcVar34,uVar43,
                     "Error writing log file %s");
        }
      }
      else if (file.access.fp != (FILE *)0x0) {
        fclose((FILE *)file.access.fp);
      }
    }
  }
  else {
LAB_0011599d:
    *(undefined4 *)((long)thread_func_param + 4) = 0xffffffff;
LAB_001159a5:
    *(undefined4 *)((long)thread_func_param + 0x980) = 1;
  }
LAB_001159b0:
  free_buffered_response_header_list((mg_connection *)thread_func_param);
  if (*(void **)((long)thread_func_param + 0x40) != (void *)0x0) {
    free(*(void **)((long)thread_func_param + 0x40));
    *(undefined8 *)((long)thread_func_param + 0x40) = 0;
  }
  __mutex = local_41b0;
  if ((((*(int *)(*(long *)((long)thread_func_param + 0x8e0) + 0x28) == 0) &&
       (iVar24 = should_keep_alive((mg_connection *)thread_func_param), iVar24 != 0)) &&
      (lVar47 = *(long *)((long)thread_func_param + 0x958), -1 < lVar47)) &&
     (lVar40 = (long)*(int *)((long)thread_func_param + 0x994), 0 < lVar40)) {
    if (*(int *)((long)thread_func_param + 0x968) != 4) {
      if (*(int *)((long)thread_func_param + 0x968) != 0) goto LAB_001159e3;
      if ((*(long *)((long)thread_func_param + 0x960) != lVar47) &&
         (uVar43 = *(uint *)((long)thread_func_param + 0x998), (long)(int)uVar43 < lVar47 + lVar40))
      {
        bVar20 = false;
        goto LAB_001159ec;
      }
    }
    if (*(int *)((long)thread_func_param + 4) != 0) goto LAB_001159e3;
    iVar24 = *(int *)((long)thread_func_param + 0x998);
    iVar25 = (int)(lVar47 + lVar40);
    if ((long)iVar24 <= lVar47 + lVar40) {
      iVar25 = iVar24;
    }
    uVar43 = iVar24 - iVar25;
    *(uint *)((long)thread_func_param + 0x998) = uVar43;
    if (uVar43 == 0 || iVar24 < iVar25) {
      bVar20 = true;
      goto LAB_001159ec;
    }
    memmove(*(void **)((long)thread_func_param + 0x970),
            (void *)((long)iVar25 + (long)*(void **)((long)thread_func_param + 0x970)),(ulong)uVar43
           );
    bVar20 = true;
  }
  else {
LAB_001159e3:
    bVar20 = false;
  }
  uVar43 = *(uint *)((long)thread_func_param + 0x998);
LAB_001159ec:
  if ((((int)uVar43 < 0) || (*(int *)((long)thread_func_param + 0x990) < (int)uVar43)) ||
     (*(int *)((long)thread_func_param + 0x98c) = *(int *)((long)thread_func_param + 0x98c) + 1,
     !bVar20)) goto LAB_00116f41;
  goto LAB_0011545f;
  while (lVar47 = lVar47 + 1, iVar24 == iVar25) {
LAB_001156c4:
    bVar3 = *(byte *)(*(long *)(*(long *)((long)thread_func_param + 0x8e8) + 0x100) + lVar47);
    iVar24 = (*local_4260)[bVar3];
    iVar25 = (*local_4260)[(byte)"yes"[lVar47]];
    if (bVar3 == 0) break;
  }
  lVar47 = 0x18;
  pcVar34 = "http://";
  do {
    sVar9 = *(size_t *)((long)&http_methods[0x10].is_safe + lVar47);
    iVar26 = mg_strncasecmp(pcVar32,pcVar34,sVar9);
    if (iVar26 == 0) {
      pcVar44 = pcVar32 + sVar9;
      pcVar34 = strchr(pcVar44,0x2f);
      if (pcVar34 == (char *)0x0) break;
      pcVar33 = strchr(pcVar44,0x3a);
      if (pcVar34 < pcVar33 || pcVar33 == (char *)0x0) {
        uVar31 = (ulong)*(uint *)((long)&http_methods[0x10].is_cacheable + lVar47);
        pcVar33 = pcVar34;
        if (uVar31 == 0) break;
      }
      else {
        uVar31 = strtoul(pcVar33 + 1,&portend,10);
        if (uVar31 - 0x10000 < 0xffffffffffff0001 || portend != pcVar34) break;
      }
      uVar45 = (long)pcVar33 - (long)pcVar44;
      if (uVar31 == (ushort)(*(ushort *)((long)thread_func_param + 0x8fe) << 8 |
                            *(ushort *)((long)thread_func_param + 0x8fe) >> 8)) {
        if (iVar24 != iVar25) goto LAB_00115987;
        pcVar33 = *(char **)(*(long *)((long)thread_func_param + 0x8e8) + 0xf8);
        sVar35 = strlen(pcVar33);
        if (((pcVar32 != (char *)0x0) && (sVar35 != 0)) &&
           (((uVar45 == sVar35 && (iVar24 = bcmp(pcVar33,pcVar44,uVar45), iVar24 == 0)) ||
            (((sVar35 + 2 <= uVar45 && (pcVar44[~sVar35 + uVar45] == '.')) &&
             (iVar24 = bcmp(pcVar33,pcVar44 + (uVar45 - sVar35),sVar35), iVar24 == 0))))))
        goto LAB_00115987;
      }
      break;
    }
    pcVar34 = *(char **)((long)&abs_uri_protocols[0].proto + lVar47);
    lVar47 = lVar47 + 0x18;
  } while (lVar47 != 0x78);
  pcVar34 = (char *)0x0;
  goto LAB_00115987;
LAB_00116f41:
  close_connection((mg_connection *)thread_func_param);
  goto LAB_00115266;
}

Assistant:

static void *
worker_thread(void *thread_func_param)
{
#if !defined(__ZEPHYR__)
	struct sigaction sa;

	/* Ignore SIGPIPE */
	memset(&sa, 0, sizeof(sa));
	sa.sa_handler = SIG_IGN;
	sigaction(SIGPIPE, &sa, NULL);
#endif

	worker_thread_run((struct mg_connection *)thread_func_param);
	return NULL;
}